

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *__s;
  double dVar1;
  uint flags;
  undefined1 n [16];
  basic_fp<unsigned___int128> value_00;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  type tVar5;
  size_t count;
  ulong uVar6;
  undefined8 uVar7;
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffff72;
  int local_6c;
  float local_68;
  longdouble local_64;
  basic_fp<unsigned___int128> f;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xc1e,"value is negative");
  }
  uVar6 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar6 != 0x200000000) {
      f.f._0_1_ = 0x30;
      buffer<char>::push_back(buf,(char *)&f);
      local_6c = 0;
    }
    else {
      tVar5 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar5);
      __s = buf->ptr_;
      tVar5 = to_unsigned<int>(precision);
      memset(__s,0x30,(ulong)tVar5);
      local_6c = -precision;
    }
  }
  else {
    local_64 = value;
    uVar7 = SUB108(value,0);
    uVar8 = (undefined2)((unkuint10)value >> 0x40);
    basic_fp<unsigned___int128>::assign<long_double,_0>(&f,value);
    n._8_2_ = uVar8;
    n._0_8_ = uVar7;
    n._10_6_ = in_stack_ffffffffffffff72;
    iVar4 = count_digits<1,unsigned__int128>((unsigned___int128)n);
    dVar1 = ceil((double)(iVar4 + f.e + -1) * 0.3010299956639812 + -1e-10);
    local_6c = (int)dVar1;
    f.f._0_8_ = 0;
    f.f._8_8_ = 0;
    f.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      bVar3 = basic_fp<unsigned___int128>::assign<long_double,_0>(&f,local_64);
    }
    else {
      local_68 = (float)local_64;
      bVar3 = basic_fp<unsigned___int128>::assign<float,_0>(&f,local_68);
    }
    flags = bVar3 | 6;
    if (uVar6 != 0x200000000) {
      flags = bVar3 + 2;
    }
    iVar4 = 0x2ff;
    if (precision < 0x2ff) {
      iVar4 = precision;
    }
    value_00._20_4_ = f._20_4_;
    value_00.e = f.e;
    value_00.f._8_2_ = (short)f.f._8_8_;
    value_00.f._0_8_ = (undefined8)f.f;
    value_00.f._10_6_ = (int6)((ulong)f.f._8_8_ >> 0x10);
    value_00._24_8_ = f._24_8_;
    format_dragon(value_00,flags,iVar4,buf,&local_6c);
    if ((specs._4_4_ >> 0x13 & 1) == 0 && uVar6 != 0x200000000) {
      sVar2 = buf->size_;
      iVar4 = local_6c;
      do {
        local_6c = iVar4;
        count = sVar2;
        if (count == 0) break;
        sVar2 = count - 1;
        iVar4 = local_6c + 1;
      } while (buf->ptr_[count - 1] == '0');
      buffer<char>::try_resize(buf,count);
    }
  }
  return local_6c;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}